

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O0

void __thiscall Archive::dump(Archive *this)

{
  bool *this_00;
  uint uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  char *pcVar7;
  size_type sVar8;
  Child *pCVar9;
  undefined8 uVar10;
  Child local_d8;
  undefined1 local_c0 [8];
  child_iterator it;
  uint8_t *loc;
  uint32_t offset;
  Symbol sym;
  uint32_t string_start_offset;
  uint32_t symbolCount;
  string local_78;
  undefined1 local_58 [8];
  child_iterator e;
  child_iterator c;
  uint8_t *buf;
  Archive *this_local;
  
  pcVar7 = std::vector<char,_std::allocator<char>_>::data(this->data);
  sVar8 = std::vector<char,_std::allocator<char>_>::size(this->data);
  printf("Archive data %p len %zu, firstRegularData %p\n",pcVar7,sVar8,this->firstRegularData);
  printf("Symbol table %p, len %u\n",(this->symbolTable).data,(ulong)(this->symbolTable).len);
  printf("string table %p, len %u\n",(this->stringTable).data,(ulong)(this->stringTable).len);
  puVar2 = (this->symbolTable).data;
  if (puVar2 == (uint8_t *)0x0) {
    child_begin((child_iterator *)&e.error,this,true);
    child_end((child_iterator *)local_58,this);
    while (bVar4 = child_iterator::operator!=((child_iterator *)&e.error,(child_iterator *)local_58)
          , bVar4) {
      this_00 = &e.error;
      pCVar9 = child_iterator::operator->((child_iterator *)this_00);
      puVar2 = pCVar9->data;
      pCVar9 = child_iterator::operator->((child_iterator *)this_00);
      uVar1 = pCVar9->len;
      pCVar9 = child_iterator::operator->((child_iterator *)this_00);
      Child::getName_abi_cxx11_(&local_78,pCVar9);
      uVar10 = std::__cxx11::string::c_str();
      pCVar9 = child_iterator::operator->((child_iterator *)this_00);
      uVar5 = Child::getSize(pCVar9);
      printf("Child %p, len %u, name %s, size %u\n",puVar2,(ulong)uVar1,uVar10,(ulong)uVar5);
      std::__cxx11::string::~string((string *)&local_78);
      child_iterator::operator++((child_iterator *)&e.error);
    }
  }
  else {
    uVar5 = read32be(puVar2);
    printf("Symbol count %u\n",(ulong)uVar5);
    puVar3 = (this->symbolTable).data;
    while (uVar5 != 0) {
      printf("Symbol %u, offset %u\n",0,(ulong)((uVar5 * 4 + 4 + (int)puVar2) - (int)puVar3));
      uVar6 = read32be((this->symbolTable).data);
      it._24_8_ = std::vector<char,_std::allocator<char>_>::operator[](this->data,(ulong)uVar6);
      child_iterator::child_iterator((child_iterator *)local_c0);
      Child::Child(&local_d8,this,(uint8_t *)it._24_8_,(bool *)&it.child.len);
      local_c0 = (undefined1  [8])local_d8.parent;
      it.child.parent = (Archive *)local_d8.data;
      it.child.data._0_4_ = local_d8.len;
      it.child.data._4_2_ = local_d8.startOfFile;
      printf("Child %p, len %u\n",local_d8.data,(ulong)local_d8.len);
    }
  }
  return;
}

Assistant:

void Archive::dump() const {
  printf("Archive data %p len %zu, firstRegularData %p\n",
         data.data(),
         data.size(),
         firstRegularData);
  printf("Symbol table %p, len %u\n", symbolTable.data, symbolTable.len);
  printf("string table %p, len %u\n", stringTable.data, stringTable.len);
  const uint8_t* buf = symbolTable.data;
  if (!buf) {
    for (auto c = child_begin(), e = child_end(); c != e; ++c) {
      printf("Child %p, len %u, name %s, size %u\n",
             c->data,
             c->len,
             c->getName().c_str(),
             c->getSize());
    }
    return;
  }
  uint32_t symbolCount = read32be(buf);
  printf("Symbol count %u\n", symbolCount);
  buf += sizeof(uint32_t) + (symbolCount * sizeof(uint32_t));
  uint32_t string_start_offset = buf - symbolTable.data;
  Symbol sym = {0, string_start_offset};
  while (sym.symbolIndex != symbolCount) {
    printf("Symbol %u, offset %u\n", sym.symbolIndex, sym.stringIndex);
    // get the member
    uint32_t offset = read32be(symbolTable.data + sym.symbolIndex * 4);
    auto* loc = (const uint8_t*)&data[offset];
    child_iterator it;
    it.child = Child(this, loc, &it.error);
    printf("Child %p, len %u\n", it.child.data, it.child.len);
  }
}